

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O0

bool __thiscall Expression::evaluateInteger<signed_char>(Expression *this,char *dest)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_50 [8];
  ExpressionValue value;
  char *dest_local;
  Expression *this_local;
  
  value.strValue._value.field_2._8_8_ = dest;
  bVar1 = std::operator==(&this->expression,(nullptr_t)0x0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = std::__shared_ptr_access<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    ExpressionInternal::evaluate((ExpressionValue *)local_50,this_00);
    this_local._7_1_ = ExpressionValue::isInt((ExpressionValue *)local_50);
    if (this_local._7_1_) {
      *(undefined1 *)value.strValue._value.field_2._8_8_ = (undefined1)value.type;
    }
    ExpressionValue::~ExpressionValue((ExpressionValue *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool evaluateInteger(T& dest)
	{
		if (expression == nullptr)
			return false;

		ExpressionValue value = expression->evaluate();
		if (value.isInt() == false)
			return false;

		dest = (T) value.intValue;
		return true;
	}